

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyle.cpp
# Opt level: O2

QRect __thiscall QStyle::itemPixmapRect(QStyle *this,QRect *rect,int alignment,QPixmap *pixmap)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  double dVar7;
  double in_XMM1_Qa;
  QRect QVar8;
  
  iVar4 = (rect->x1).m_i;
  iVar5 = (rect->y1).m_i;
  iVar1 = (rect->x2).m_i;
  iVar6 = (rect->y2).m_i;
  dVar7 = (double)QPixmap::deviceIndependentSize();
  iVar3 = (int)in_XMM1_Qa;
  if ((char)alignment < '\0') {
    iVar5 = iVar3 / -2 + iVar5 + ((iVar6 - iVar5) + 1) / 2;
  }
  else if ((alignment & 0x40U) != 0) {
    iVar5 = (iVar6 - iVar3) + 1;
  }
  iVar6 = (int)dVar7;
  if ((alignment & 2U) == 0) {
    if ((alignment & 4U) != 0) {
      iVar4 = iVar6 / -2 + iVar4 + ((iVar1 - iVar4) + 1) / 2;
      goto LAB_00336509;
    }
    if ((alignment & 1U) != 0) goto LAB_00336509;
    bVar2 = QGuiApplication::isRightToLeft();
    if (!bVar2) goto LAB_00336509;
  }
  iVar4 = (iVar1 - iVar6) + 1;
LAB_00336509:
  QVar8.x2.m_i = iVar6 + iVar4 + -1;
  QVar8.y1.m_i = iVar5;
  QVar8.x1.m_i = iVar4;
  QVar8.y2.m_i = iVar3 + iVar5 + -1;
  return QVar8;
}

Assistant:

QRect QStyle::itemPixmapRect(const QRect &rect, int alignment, const QPixmap &pixmap) const
{
    QRect result;
    int x, y, w, h;
    rect.getRect(&x, &y, &w, &h);

    QSizeF pixmapSize = pixmap.deviceIndependentSize();
    const int pixmapWidth = pixmapSize.width();
    const int pixmapHeight = pixmapSize.height();

    if ((alignment & Qt::AlignVCenter) == Qt::AlignVCenter)
        y += h/2 - pixmapHeight/2;
    else if ((alignment & Qt::AlignBottom) == Qt::AlignBottom)
        y += h - pixmapHeight;
    if ((alignment & Qt::AlignRight) == Qt::AlignRight)
        x += w - pixmapWidth;
    else if ((alignment & Qt::AlignHCenter) == Qt::AlignHCenter)
        x += w/2 - pixmapWidth/2;
    else if ((alignment & Qt::AlignLeft) != Qt::AlignLeft && QGuiApplication::isRightToLeft())
        x += w - pixmapWidth;
    result = QRect(x, y, pixmapWidth, pixmapHeight);
    return result;
}